

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O3

bool __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::verifyColorData
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,_texture_size *texture_size,
          GLuint n_layer)

{
  GLuint GVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  uint *image;
  GLuint expected [4];
  GLuint local_38 [4];
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar1 = texture_size->m_size;
  image = (uint *)operator_new__((ulong)(GVar1 * GVar1 * 4) << 2);
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1220))(0,0,GVar1,GVar1,0x8d99,0x1404,image);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glReadPixels() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x415);
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 1;
  local_38[0] = n_layer;
  bVar2 = verifyImage<unsigned_int,4u>(texture_size->m_size,texture_size->m_size,local_38,image);
  operator_delete__(image);
  return bVar2;
}

Assistant:

bool TextureCubeMapArrayColorDepthAttachmentsTest::verifyColorData(const _texture_size& texture_size,
																   glw::GLuint			n_layer)
{
	/* Allocate buffer for the data we will retrieve from the implementation */
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	bool				  result		   = false;
	const glw::GLuint	 result_data_size = texture_size.m_size * texture_size.m_size * 4;
	glw::GLuint*		  result_data	  = new glw::GLuint[result_data_size];

	DE_ASSERT(result_data != NULL);

	/* Read the data */
	gl.readPixels(0, /* x */
				  0, /* y */
				  texture_size.m_size, texture_size.m_size, GL_RGBA_INTEGER, m_color_type, result_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed");

	glw::GLuint expected[4] = { n_layer, 0, 0, 1 };

	/* Verify image, expected value is layer index */
	result = verifyImage<glw::GLuint, 4>(texture_size.m_size, texture_size.m_size, expected, result_data);

	/* Release the buffer */
	if (result_data != NULL)
	{
		delete[] result_data;

		result_data = NULL;
	}

	return result;
}